

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neurons.cpp
# Opt level: O0

int main(void)

{
  size_type sVar1;
  ostream *poVar2;
  void *pvVar3;
  undefined1 local_a8 [8];
  NeuronLayer nl;
  undefined1 local_80 [8];
  Neuron n2;
  Neuron n1;
  
  n1._52_4_ = 0;
  Neuron::Neuron((Neuron *)&n2.id);
  Neuron::Neuron((Neuron *)local_80);
  Neuron::connect_to<Neuron>((Neuron *)&n2.id,(Neuron *)local_80);
  Neuron::connect_to<Neuron>((Neuron *)local_80,(Neuron *)&n2.id);
  sVar1 = std::
          vector<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>::
          size((vector<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
                *)&n2.id);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,sVar1);
  poVar2 = std::operator<<(poVar2," ");
  sVar1 = std::
          vector<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>::
          size((vector<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
                *)&n1.in.
                   super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,sVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  sVar1 = std::
          vector<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>::
          size((vector<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
                *)local_80);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,sVar1);
  poVar2 = std::operator<<(poVar2," ");
  sVar1 = std::
          vector<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>::
          size((vector<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
                *)&n2.in.
                   super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,sVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = operator<<((ostream *)&std::cout,(Neuron *)&n2.id);
  poVar2 = operator<<(poVar2,(Neuron *)local_80);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  NeuronLayer::NeuronLayer((NeuronLayer *)local_a8,0xe);
  NeuronLayer::connect_to<Neuron>((NeuronLayer *)local_a8,(Neuron *)&n2.id);
  poVar2 = operator<<((ostream *)&std::cout,(NeuronLayer *)local_a8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  n1._52_4_ = 0;
  NeuronLayer::~NeuronLayer((NeuronLayer *)local_a8);
  Neuron::~Neuron((Neuron *)local_80);
  Neuron::~Neuron((Neuron *)&n2.id);
  return n1._52_4_;
}

Assistant:

int main()
{
	Neuron n1, n2;
	n1.connect_to(n2);
	n2.connect_to(n1);
	std::cout << n1.in.size() << " " << n1.out.size() << std::endl;
	std::cout << n2.in.size() << " " << n2.out.size() << std::endl;
	std::cout << n1 << n2 << std::endl;

	NeuronLayer nl{14};
	nl.connect_to(n1);
	std::cout << nl << std::endl;

	return 0;
}